

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cxx
# Opt level: O1

void __thiscall SSD1306::FileDescriptor::FileDescriptor(FileDescriptor *this,FileDescriptor *rhs)

{
  CloseIfFunction *pCVar1;
  _Manager_type *pp_Var2;
  undefined8 uVar3;
  _func_bool__Any_data_ptr_int_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  this->fd_ = rhs->fd_;
  pCVar1 = &rhs->close_if_;
  *(undefined8 *)&(this->close_if_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->close_if_).super__Function_base._M_functor + 8) = 0;
  (this->close_if_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->close_if_)._M_invoker = (rhs->close_if_)._M_invoker;
  if ((rhs->close_if_).super__Function_base._M_manager != (_Manager_type)0x0) {
    pp_Var2 = &(rhs->close_if_).super__Function_base._M_manager;
    uVar3 = *(undefined8 *)((long)&(rhs->close_if_).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->close_if_).super__Function_base._M_functor =
         *(undefined8 *)&(pCVar1->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->close_if_).super__Function_base._M_functor + 8) = uVar3;
    (this->close_if_).super__Function_base._M_manager = *pp_Var2;
    *pp_Var2 = (_Manager_type)0x0;
    (rhs->close_if_)._M_invoker = (_Invoker_type)0x0;
  }
  rhs->fd_ = -1;
  local_28._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pCVar1->super__Function_base)._M_functor;
  local_28._8_8_ = *(undefined8 *)((long)&(rhs->close_if_).super__Function_base._M_functor + 8);
  *(undefined8 *)&(pCVar1->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(rhs->close_if_).super__Function_base._M_functor + 8) = 0;
  local_18 = (rhs->close_if_).super__Function_base._M_manager;
  (rhs->close_if_).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.cxx:62:21)>
       ::_M_manager;
  local_10 = (rhs->close_if_)._M_invoker;
  (rhs->close_if_)._M_invoker =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.cxx:62:21)>
       ::_M_invoke;
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

SSD1306::FileDescriptor::FileDescriptor(
    SSD1306::FileDescriptor&& rhs)
:
    fd_{rhs.fd_},
    close_if_{std::move(rhs.close_if_)}
{
    rhs.fd_ = -1;
    rhs.close_if_ = [](int) { return false; };
}